

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Type * __thiscall
soul::heart::Parser::parseVectorOrArrayTypeSuffixes
          (Type *__return_storage_ptr__,Parser *this,PrimitiveType *elementType)

{
  Primitive PVar1;
  Type *pTVar2;
  bool bVar3;
  ArraySize size;
  PrimitiveType local_94;
  Type local_90;
  Type local_78;
  CompileMessage local_60;
  
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2a352e);
  PVar1 = elementType->type;
  if (bVar3) {
    if (((bool_ < PVar1) || ((0x39cU >> (PVar1 & 0x1f) & 1) == 0)) && (1 < PVar1 - complex32)) {
      Errors::wrongTypeForArrayElement<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
    size = parseLiteralInt(this);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2c92c0);
    if (0xff < size - 1) {
      Errors::illegalVectorSize<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
    local_94 = (PrimitiveType)elementType->type;
    Type::createVector(&local_78,&local_94,size);
    parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_78);
    pTVar2 = &local_78;
  }
  else {
    local_90.category = PVar1 != invalid;
    local_90.arrayElementCategory = invalid;
    local_90.isRef = false;
    local_90.isConstant = false;
    local_90.boundingSize = 0;
    local_90.arrayElementBoundingSize = 0;
    local_90.structure.object = (Structure *)0x0;
    local_90.primitiveType.type = PVar1;
    parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_90);
    pTVar2 = &local_90;
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&pTVar2->structure);
  return __return_storage_ptr__;
}

Assistant:

Type parseVectorOrArrayTypeSuffixes (PrimitiveType elementType)
    {
        if (matchIf (HEARTOperator::lessThan))
        {
            if (! elementType.canBeVectorElementType())
                throwError (Errors::wrongTypeForArrayElement());

            auto size = parseLiteralInt();
            expect (HEARTOperator::greaterThan);

            if (! Type::isLegalVectorSize (size))
                throwError (Errors::illegalVectorSize());

            return parseArrayTypeSuffixes (Type::createVector (elementType, static_cast<Type::ArraySize> (size)));
        }

        return parseArrayTypeSuffixes (elementType);
    }